

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

bool __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::equalsn
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,char *str1,char *str2,int len)

{
  bool bVar1;
  bool local_33;
  bool local_32;
  int local_30;
  int i;
  int len_local;
  char *str2_local;
  char *str1_local;
  CXMLReaderImpl<char,_irr::io::IXMLBase> *this_local;
  
  local_30 = 0;
  while( true ) {
    bVar1 = false;
    if ((str1[local_30] != '\0') && (bVar1 = false, str2[local_30] != '\0')) {
      bVar1 = local_30 < len;
    }
    if (!bVar1) break;
    if (str1[local_30] != str2[local_30]) {
      return false;
    }
    local_30 = local_30 + 1;
  }
  local_32 = true;
  if (local_30 != len) {
    local_33 = false;
    if (str1[local_30] == '\0') {
      local_33 = str2[local_30] == '\0';
    }
    local_32 = local_33;
  }
  return local_32;
}

Assistant:

bool equalsn(const char_type* str1, const char_type* str2, int len)
	{
		int i;
		for(i=0; str1[i] && str2[i] && i < len; ++i)
			if (str1[i] != str2[i])
				return false;

		// if one (or both) of the strings was smaller then they
		// are only equal if they have the same lenght
		return (i == len) || (str1[i] == 0 && str2[i] == 0);
	}